

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_DomProperty_*>_>::Bucket::advance_impl
          (Bucket *this,Data<QHashPrivate::Node<QString,_DomProperty_*>_> *d,Span *whenAtEnd)

{
  Span *pSVar1;
  size_t sVar2;
  
  sVar2 = this->index + 1;
  this->index = sVar2;
  if (sVar2 == 0x80) {
    this->index = 0;
    pSVar1 = this->span;
    this->span = pSVar1 + 1;
    if (((long)(pSVar1 + 1) - (long)d->spans) / 0x90 == d->numBuckets >> 7) {
      this->span = whenAtEnd;
      return;
    }
  }
  return;
}

Assistant:

void advance_impl(const Data *d, Span *whenAtEnd) noexcept
        {
            Q_ASSERT(span);
            ++index;
            if (Q_UNLIKELY(index == SpanConstants::NEntries)) {
                index = 0;
                ++span;
                if (span - d->spans == ptrdiff_t(d->numBuckets >> SpanConstants::SpanShift))
                    span = whenAtEnd;
            }
        }